

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell.c
# Opt level: O3

void losespells(void)

{
  ulong uVar1;
  
  book = (obj *)0x0;
  uVar1 = 0;
  do {
    if (spl_book[uVar1].sp_id == 0) {
      if (uVar1 == 0) {
        return;
      }
      goto LAB_0024a92b;
    }
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0x2b);
  uVar1 = 0x2b;
LAB_0024a92b:
  mt_random();
  *(undefined2 *)((long)mvitals + (uVar1 & 0xffffffff) * 8 + 0x4b8) = 0;
  exercise(2,'\0');
  return;
}

Assistant:

void losespells(void)
{
	boolean confused = (Confusion != 0);
	int  n, nzap, i;

	book = 0;
	for (n = 0; n < MAXSPELL && spellid(n) != NO_SPELL; n++)
		continue;
	if (n) {
		nzap = rnd(n) + confused ? 1 : 0;
		if (nzap > n) nzap = n;
		for (i = n - nzap; i < n; i++) {
		    spellid(i) = NO_SPELL;
		    exercise(A_WIS, FALSE);	/* ouch! */
		}
	}
}